

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

void NULLCPugiXML::xml_document__save
               (NULLCFuncPtr writer,NULLCArray indent,int flags,xml_encoding encoding,
               xml_document *document)

{
  undefined1 local_68 [8];
  xml_writer_nullc writer_nullc;
  xml_document *doc;
  xml_encoding encoding_local;
  int flags_local;
  NULLCArray indent_local;
  NULLCFuncPtr writer_local;
  
  if (document->impl == (xml_document_impl *)0x0) {
    nullcThrowError("xml_document constructor wasn\'t called");
  }
  else {
    writer_nullc._16_8_ = document->impl->document;
    if ((xml_document *)writer_nullc._16_8_ == (xml_document *)0x0) {
      nullcThrowError("xml_document::save document is empty, you must create document first");
    }
    else {
      xml_writer_nullc::xml_writer_nullc((xml_writer_nullc *)local_68,writer);
      pugi::xml_document::save
                ((xml_document *)writer_nullc._16_8_,(xml_writer *)local_68,indent.ptr,flags,
                 encoding);
      xml_writer_nullc::~xml_writer_nullc((xml_writer_nullc *)local_68);
    }
  }
  return;
}

Assistant:

void xml_document__save(NULLCFuncPtr writer, NULLCArray indent, int flags, pugi::xml_encoding encoding, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			nullcThrowError("xml_document::save document is empty, you must create document first");
			return;
		}
		xml_writer_nullc writer_nullc = xml_writer_nullc(writer);
		doc->save(writer_nullc, indent.ptr, flags, encoding);
	}